

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::_makeunreachable(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  WeightedOption rest_4;
  WeightedOption rest_5;
  WeightedOption rest_6;
  WeightedOption rest_7;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_00;
  Expression *pEVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_1f0;
  Type local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  FeatureSet local_19c;
  code *local_198;
  undefined8 uStack_190;
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  code *local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  code *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  code *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  FeatureSet local_4c;
  undefined1 auStack_48 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  TranslateToFuzzReader *this_local;
  
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auStack_48 = (undefined1  [8])0x0;
  options.options._M_t._M_impl._0_8_ = 0;
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 auStack_48);
  FeatureSet::FeatureSet(&local_4c,0);
  local_78 = makeLocalSet;
  uStack_70 = 0;
  local_68 = 4;
  local_90 = makeBlock;
  uStack_88 = 0;
  local_80 = 2;
  local_a8 = makeIf;
  uStack_a0 = 0;
  local_98 = 2;
  local_c0 = makeLoop;
  uStack_b8 = 0;
  local_b0 = 2;
  local_d8 = makeBreak;
  uStack_d0 = 0;
  local_c8 = 2;
  local_f0 = makeStore;
  uStack_e8 = 0;
  local_e0 = 2;
  local_108 = makeUnary;
  uStack_100 = 0;
  local_f8 = 2;
  local_120 = makeBinary;
  uStack_118 = 0;
  local_110 = 2;
  local_138 = makeUnreachable;
  uStack_130 = 0;
  local_128 = 2;
  local_148 = makeCall;
  local_140 = 0;
  local_158 = makeCallIndirect;
  local_150 = 0;
  local_168 = makeSelect;
  uStack_160 = 0;
  local_178 = makeSwitch;
  uStack_170 = 0;
  local_188 = makeDrop;
  uStack_180 = 0;
  local_198 = makeReturn;
  uStack_190 = 0;
  weightedOption.weight = 4;
  weightedOption._0_16_ = ZEXT816(0x1925c0);
  rest.weight = 2;
  rest._0_16_ = ZEXT816(0x190f70);
  rest_1.weight = 2;
  rest_1._0_16_ = ZEXT816(0x193c80);
  rest_2.weight = 2;
  rest_2._0_16_ = ZEXT816(0x193d40);
  rest_3.weight = 2;
  rest_3._0_16_ = ZEXT816(0x193ff0);
  rest_4.weight = 2;
  rest_4._0_16_ = ZEXT816(0x199750);
  rest_5.weight = 2;
  rest_5._0_16_ = ZEXT816(0x1950d0);
  rest_6.weight = 2;
  rest_6._0_16_ = ZEXT816(0x196340);
  rest_7.weight = 2;
  rest_7._0_16_ = ZEXT816(0x199c50);
  this_00 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                        *)auStack_48,local_4c,weightedOption,rest,rest_1,rest_2,rest_3,rest_4,rest_5
                       ,rest_6,rest_7,0x1944c0,0,0x194840,0,0x196f70,0);
  FeatureSet::FeatureSet(&local_19c,0x500);
  local_1b0 = makeCallRef;
  local_1a8 = 0;
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
            (this_00,local_19c,0x194d10);
  local_1f0 = (code *)_wasm__TranslateToFuzzReader___constwasm__TranslateToFuzzReader__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                                (this,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                       *)auStack_48);
  plVar2 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)local_1f0 & 1) != 0) {
    local_1f0 = *(code **)(local_1f0 + *plVar2 + -1);
  }
  Type::Type(&local_1b8,unreachable);
  pEVar1 = (Expression *)(*local_1f0)(plVar2,local_1b8.id);
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  ~FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                  auStack_48);
  return pEVar1;
}

Assistant:

Expression* TranslateToFuzzReader::_makeunreachable() {
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         WeightedOption{&Self::makeUnary, Important},
         WeightedOption{&Self::makeBinary, Important},
         WeightedOption{&Self::makeUnreachable, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeSelect,
         &Self::makeSwitch,
         &Self::makeDrop,
         &Self::makeReturn)
    .add(FeatureSet::GC | FeatureSet::ReferenceTypes, &Self::makeCallRef);
  return (this->*pick(options))(Type::unreachable);
}